

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

pid_t testing::internal::ExecDeathTestSpawnChild(char **argv,int close_fd)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int gtest_retval_1;
  void *stack_top;
  size_t kMaxStackAlignment;
  void *stack;
  size_t stack_size;
  bool use_fork;
  int gtest_retval;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  pid_t child_pid;
  ExecDeathTestArgs args;
  char *in_stack_fffffffffffff840;
  allocator *__rhs;
  undefined7 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84f;
  undefined1 uVar4;
  string *in_stack_fffffffffffff850;
  string *message;
  bool local_799;
  int *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_741;
  string local_740 [196];
  undefined4 local_67c;
  allocator local_651;
  string local_650 [224];
  int local_570;
  undefined4 local_56c;
  undefined1 local_541 [97];
  void *in_stack_fffffffffffffb20;
  allocator local_451;
  string local_450 [192];
  _Alloc_hider *local_390;
  undefined8 local_388;
  undefined4 local_37c;
  undefined1 local_351 [193];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  size_t local_288;
  byte local_27d;
  undefined4 local_27c;
  allocator local_241;
  string local_240 [228];
  int local_15c;
  _union_1457 local_158;
  sigset_t sStack_150;
  sigaction local_c0;
  int local_24;
  undefined1 local_20 [32];
  
  local_24 = -1;
  memset(&local_158,0,0x98);
  sigemptyset(&sStack_150);
  local_158 = (_union_1457)0x1;
  while( true ) {
    do {
      local_15c = sigaction(0x1b,(sigaction *)&local_158,&local_c0);
      bVar3 = false;
      if (local_15c == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_15c == -1) break;
    bVar3 = AlwaysFalse();
    if (!bVar3) {
      local_27d = FLAGS_gtest_death_test_use_fork & 1;
      if (local_27d == 0) {
        if ((ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') &&
           (iVar1 = __cxa_guard_acquire(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down
                                       ), iVar1 != 0)) {
          ExecDeathTestSpawnChild::stack_grows_down = StackGrowsDown();
          __cxa_guard_release(&ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down);
        }
        iVar1 = getpagesize();
        local_288 = (size_t)(iVar1 << 1);
        local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    mmap((void *)0x0,local_288,3,0x22,-1,0);
        do {
          bVar3 = IsTrue(local_290 !=
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0xffffffffffffffff);
          if (!bVar3) {
            __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_351;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_351 + 1),"CHECK failed: File ",(allocator *)__lhs);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            local_37c = 0x521;
            StreamableToString<int>(in_stack_fffffffffffff868);
            std::operator+(__lhs,in_stack_fffffffffffff870);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            DeathTestAbort(in_stack_fffffffffffff850);
          }
          bVar3 = AlwaysFalse();
        } while (bVar3);
        local_388 = 0x40;
        if ((ExecDeathTestSpawnChild::stack_grows_down & 1U) == 0) {
          in_stack_fffffffffffff868 = (int *)0x0;
        }
        else {
          in_stack_fffffffffffff868 = (int *)(local_288 - 0x40);
        }
        local_390 = &local_290->_M_dataplus + (long)in_stack_fffffffffffff868;
        in_stack_fffffffffffff870 = local_290;
        do {
          local_799 = 0x40 < local_288 && ((ulong)local_390 & 0x3f) == 0;
          bVar3 = IsTrue(local_799);
          if (!bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_450,"CHECK failed: File ",&local_451);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            StreamableToString<int>(in_stack_fffffffffffff868);
            std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            DeathTestAbort(in_stack_fffffffffffff850);
          }
          bVar3 = AlwaysFalse();
        } while (bVar3);
        local_24 = clone(ExecDeathTestChildMain,local_390,0x11,local_20);
        do {
          iVar1 = munmap(local_290,local_288);
          bVar3 = IsTrue(iVar1 != -1);
          if (!bVar3) {
            message = (string *)local_541;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_541 + 1),"CHECK failed: File ",(allocator *)message);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            local_56c = 0x533;
            StreamableToString<int>(in_stack_fffffffffffff868);
            std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                           in_stack_fffffffffffff840);
            DeathTestAbort(message);
          }
          bVar3 = AlwaysFalse();
        } while (bVar3);
      }
      if (((local_27d & 1) != 0) && (local_24 = fork(), local_24 == 0)) {
        iVar1 = ExecDeathTestChildMain(in_stack_fffffffffffffb20);
        _Exit(iVar1);
      }
      while( true ) {
        do {
          local_570 = sigaction(0x1b,&local_c0,(sigaction *)0x0);
          uVar4 = false;
          if (local_570 == -1) {
            piVar2 = __errno_location();
            uVar4 = *piVar2 == 4;
          }
        } while ((bool)uVar4 != false);
        if (local_570 == -1) break;
        bVar3 = AlwaysFalse();
        if (!bVar3) {
          do {
            bVar3 = IsTrue(local_24 != -1);
            if (!bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_740,"CHECK failed: File ",&local_741);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar4,in_stack_fffffffffffff848),in_stack_fffffffffffff840);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar4,in_stack_fffffffffffff848),in_stack_fffffffffffff840);
              StreamableToString<int>(in_stack_fffffffffffff868);
              std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar4,in_stack_fffffffffffff848),in_stack_fffffffffffff840);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar4,in_stack_fffffffffffff848),in_stack_fffffffffffff840);
              DeathTestAbort(in_stack_fffffffffffff850);
            }
            bVar3 = AlwaysFalse();
          } while (bVar3);
          return local_24;
        }
      }
      __rhs = &local_651;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_650,"CHECK failed: File ",__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffff848),(char *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffff848),(char *)__rhs);
      local_67c = 0x53f;
      StreamableToString<int>(in_stack_fffffffffffff868);
      std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffff848),(char *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffff848),(char *)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffff848),(char *)__rhs);
      DeathTestAbort(in_stack_fffffffffffff850);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"CHECK failed: File ",&local_241);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                 in_stack_fffffffffffff840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                 in_stack_fffffffffffff840);
  local_27c = 0x515;
  StreamableToString<int>(in_stack_fffffffffffff868);
  std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                 in_stack_fffffffffffff840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                 in_stack_fffffffffffff840);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848),
                 in_stack_fffffffffffff840);
  DeathTestAbort(in_stack_fffffffffffff850);
}

Assistant:

static pid_t ExecDeathTestSpawnChild(char* const* argv, int close_fd) {
  ExecDeathTestArgs args = {argv, close_fd};
  pid_t child_pid = -1;

#ifdef GTEST_OS_QNX
  // Obtains the current directory and sets it to be closed in the child
  // process.
  const int cwd_fd = open(".", O_RDONLY);
  GTEST_DEATH_TEST_CHECK_(cwd_fd != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fcntl(cwd_fd, F_SETFD, FD_CLOEXEC));
  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir +
                   "\") failed: " + GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  int fd_flags;
  // Set close_fd to be closed after spawn.
  GTEST_DEATH_TEST_CHECK_SYSCALL_(fd_flags = fcntl(close_fd, F_GETFD));
  GTEST_DEATH_TEST_CHECK_SYSCALL_(
      fcntl(close_fd, F_SETFD, fd_flags | FD_CLOEXEC));
  struct inheritance inherit = {0};
  // spawn is a system call.
  child_pid = spawn(args.argv[0], 0, nullptr, &inherit, args.argv, environ);
  // Restores the current working directory.
  GTEST_DEATH_TEST_CHECK_(fchdir(cwd_fd) != -1);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(cwd_fd));

#else  // GTEST_OS_QNX
#ifdef GTEST_OS_LINUX
  // When a SIGPROF signal is received while fork() or clone() are executing,
  // the process may hang. To avoid this, we ignore SIGPROF here and re-enable
  // it after the call to fork()/clone() is complete.
  struct sigaction saved_sigprof_action;
  struct sigaction ignore_sigprof_action;
  memset(&ignore_sigprof_action, 0, sizeof(ignore_sigprof_action));
  sigemptyset(&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.sa_handler = SIG_IGN;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(
      sigaction(SIGPROF, &ignore_sigprof_action, &saved_sigprof_action));
#endif  // GTEST_OS_LINUX

#if GTEST_HAS_CLONE
  const bool use_fork = GTEST_FLAG_GET(death_test_use_fork);

  if (!use_fork) {
    static const bool stack_grows_down = StackGrowsDown();
    const auto stack_size = static_cast<size_t>(getpagesize() * 2);
    // MMAP_ANONYMOUS is not defined on Mac, so we use MAP_ANON instead.
    void* const stack = mmap(nullptr, stack_size, PROT_READ | PROT_WRITE,
                             MAP_ANON | MAP_PRIVATE, -1, 0);
    GTEST_DEATH_TEST_CHECK_(stack != MAP_FAILED);

    // Maximum stack alignment in bytes:  For a downward-growing stack, this
    // amount is subtracted from size of the stack space to get an address
    // that is within the stack space and is aligned on all systems we care
    // about.  As far as I know there is no ABI with stack alignment greater
    // than 64.  We assume stack and stack_size already have alignment of
    // kMaxStackAlignment.
    const size_t kMaxStackAlignment = 64;
    void* const stack_top =
        static_cast<char*>(stack) +
        (stack_grows_down ? stack_size - kMaxStackAlignment : 0);
    GTEST_DEATH_TEST_CHECK_(
        static_cast<size_t>(stack_size) > kMaxStackAlignment &&
        reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0);

    child_pid = clone(&ExecDeathTestChildMain, stack_top, SIGCHLD, &args);

    GTEST_DEATH_TEST_CHECK_(munmap(stack, stack_size) != -1);
  }
#else
  const bool use_fork = true;
#endif  // GTEST_HAS_CLONE

  if (use_fork && (child_pid = fork()) == 0) {
    _Exit(ExecDeathTestChildMain(&args));
  }
#endif  // GTEST_OS_QNX
#ifdef GTEST_OS_LINUX
  GTEST_DEATH_TEST_CHECK_SYSCALL_(
      sigaction(SIGPROF, &saved_sigprof_action, nullptr));
#endif  // GTEST_OS_LINUX

  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  return child_pid;
}